

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O0

xmlSchematronTestPtr_conflict
xmlSchematronAddTest
          (xmlSchematronParserCtxtPtr ctxt,xmlSchematronTestType type,
          xmlSchematronRulePtr_conflict rule,xmlNodePtr node,xmlChar *test,xmlChar *report)

{
  xmlXPathCompExprPtr pxVar1;
  xmlSchematronTestPtr_conflict local_58;
  xmlSchematronTestPtr_conflict prev;
  xmlXPathCompExprPtr comp;
  xmlSchematronTestPtr_conflict ret;
  xmlChar *report_local;
  xmlChar *test_local;
  xmlNodePtr node_local;
  xmlSchematronRulePtr_conflict rule_local;
  xmlSchematronTestType type_local;
  xmlSchematronParserCtxtPtr ctxt_local;
  
  if ((((ctxt == (xmlSchematronParserCtxtPtr)0x0) || (rule == (xmlSchematronRulePtr_conflict)0x0))
      || (node == (xmlNodePtr)0x0)) || (test == (xmlChar *)0x0)) {
    ctxt_local = (xmlSchematronParserCtxtPtr)0x0;
  }
  else {
    pxVar1 = xmlXPathCtxtCompile(ctxt->xctxt,test);
    if (pxVar1 == (xmlXPathCompExprPtr)0x0) {
      xmlSchematronPErr(ctxt,node,0x6df,"Failed to compile test expression %s",test,(xmlChar *)0x0);
      ctxt_local = (xmlSchematronParserCtxtPtr)0x0;
    }
    else {
      ctxt_local = (xmlSchematronParserCtxtPtr)(*xmlMalloc)(0x30);
      if (ctxt_local == (xmlSchematronParserCtxtPtr)0x0) {
        xmlSchematronPErrMemory(ctxt,"allocating schema test",node);
        ctxt_local = (xmlSchematronParserCtxtPtr)0x0;
      }
      else {
        memset(ctxt_local,0,0x30);
        *(xmlSchematronTestType *)&ctxt_local->URL = type;
        ctxt_local->doc = (xmlDocPtr)node;
        *(xmlChar **)&ctxt_local->preserve = test;
        ctxt_local->buffer = (char *)pxVar1;
        *(xmlChar **)&ctxt_local->size = report;
        *(undefined8 *)ctxt_local = 0;
        if (rule->tests == (xmlSchematronTestPtr_conflict)0x0) {
          rule->tests = (xmlSchematronTestPtr_conflict)ctxt_local;
        }
        else {
          for (local_58 = rule->tests; local_58->next != (xmlSchematronTestPtr)0x0;
              local_58 = local_58->next) {
          }
          local_58->next = (xmlSchematronTestPtr)ctxt_local;
        }
      }
    }
  }
  return (xmlSchematronTestPtr_conflict)ctxt_local;
}

Assistant:

static xmlSchematronTestPtr
xmlSchematronAddTest(xmlSchematronParserCtxtPtr ctxt,
                     xmlSchematronTestType type,
                     xmlSchematronRulePtr rule,
                     xmlNodePtr node, xmlChar *test, xmlChar *report)
{
    xmlSchematronTestPtr ret;
    xmlXPathCompExprPtr comp;

    if ((ctxt == NULL) || (rule == NULL) || (node == NULL) ||
        (test == NULL))
        return(NULL);

    /*
     * try first to compile the test expression
     */
    comp = xmlXPathCtxtCompile(ctxt->xctxt, test);
    if (comp == NULL) {
	xmlSchematronPErr(ctxt, node,
	    XML_SCHEMAP_NOROOT,
	    "Failed to compile test expression %s",
	    test, NULL);
	return(NULL);
    }

    ret = (xmlSchematronTestPtr) xmlMalloc(sizeof(xmlSchematronTest));
    if (ret == NULL) {
        xmlSchematronPErrMemory(ctxt, "allocating schema test", node);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchematronTest));
    ret->type = type;
    ret->node = node;
    ret->test = test;
    ret->comp = comp;
    ret->report = report;
    ret->next = NULL;
    if (rule->tests == NULL) {
	rule->tests = ret;
    } else {
        xmlSchematronTestPtr prev = rule->tests;

	while (prev->next != NULL)
	     prev = prev->next;
        prev->next = ret;
    }
    return (ret);
}